

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

aiColor3D __thiscall Assimp::XFileParser::ReadRGB(XFileParser *this)

{
  XFileParser *in_RSI;
  ai_real aVar1;
  undefined8 extraout_XMM0_Qa;
  ai_real in_XMM1_Da;
  aiColor3D aVar2;
  
  aVar1 = ReadFloat(in_RSI);
  this->mMajorVersion = (uint)aVar1;
  aVar1 = ReadFloat(in_RSI);
  this->mMinorVersion = (uint)aVar1;
  aVar1 = ReadFloat(in_RSI);
  *(ai_real *)&this->mIsBinaryFormat = aVar1;
  TestForSeparator(in_RSI);
  aVar2.b = in_XMM1_Da;
  aVar2.r = (ai_real)(int)extraout_XMM0_Qa;
  aVar2.g = (ai_real)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return aVar2;
}

Assistant:

aiColor3D XFileParser::ReadRGB()
{
    aiColor3D color;
    color.r = ReadFloat();
    color.g = ReadFloat();
    color.b = ReadFloat();
    TestForSeparator();

    return color;
}